

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVevent_list extract_events_from_queue(CManager_conflict cm,queue_ptr que,EVevent_list list)

{
  uint uVar1;
  EVevent_list pbVar2;
  EVevent_list in_RDX;
  undefined8 *in_RSI;
  int num_of_elements;
  queue_item *last;
  queue_item *first;
  EVevent_list current_entry;
  uint in_stack_ffffffffffffffc8;
  int iVar3;
  CManager_conflict cm_00;
  long *local_28;
  EVevent_list local_18;
  
  iVar3 = 0;
  local_28 = (long *)*in_RSI;
  cm_00 = (CManager_conflict)in_RSI[1];
  while (local_18 = in_RDX, in_RDX[iVar3].length != 0xffffffffffffffff) {
    iVar3 = iVar3 + 1;
  }
  while( true ) {
    uVar1 = in_stack_ffffffffffffffc8 & 0xffffff;
    if (local_28 != (long *)0x0) {
      uVar1 = CONCAT13(cm_00 != (CManager_conflict)0x0,(int3)in_stack_ffffffffffffffc8);
    }
    in_stack_ffffffffffffffc8 = uVar1;
    if ((char)(in_stack_ffffffffffffffc8 >> 0x18) == '\0') break;
    local_18 = (EVevent_list)INT_CMrealloc(cm_00,CONCAT44(iVar3,in_stack_ffffffffffffffc8));
    pbVar2 = local_18 + iVar3;
    if ((*(int *)(*local_28 + 4) == 0) && (*(long *)(*local_28 + 0x38) == 0)) {
      encode_event(cm_00,(event_item *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
      pbVar2->length = *(size_t *)(*local_28 + 0x18);
      pbVar2->buffer = *(void **)(*local_28 + 0x10);
    }
    else {
      pbVar2->length = *(size_t *)(*local_28 + 0x18);
      pbVar2->buffer = *(void **)(*local_28 + 0x10);
    }
    iVar3 = iVar3 + 1;
    local_28 = (long *)local_28[2];
  }
  local_18[iVar3].length = 0xffffffffffffffff;
  return local_18;
}

Assistant:

EVevent_list
extract_events_from_queue(CManager cm, queue_ptr que, EVevent_list list)
{
    EVevent_list current_entry = NULL;
    queue_item *first = NULL, *last = NULL;
    int num_of_elements = 0;
    
    first = que->queue_head;
    last = que->queue_tail;
                
    while (list[num_of_elements].length != (size_t)-1) num_of_elements++;
    while(first != NULL && last != NULL) {
	list = (EVevent_list) realloc (list, (num_of_elements + 2) * sizeof(list[0]));
	current_entry = &list[num_of_elements];
	if((first->item->event_encoded) || (first->item->ioBuffer != NULL)) {
	    current_entry->length = first->item->event_len;
	    current_entry->buffer = first->item->encoded_event;
	} else {
	    encode_event(cm, first->item);
	    current_entry->length = first->item->event_len;
	    current_entry->buffer = first->item->encoded_event;
	}
	num_of_elements++;
	first = first->next;
    }
    list[num_of_elements].length = (size_t)-1;
    return list;
}